

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiWindow *window_00;
  long lVar2;
  
  piVar1 = &(GImGui->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  AddDrawListToDrawData((window->Viewport->DrawDataBuilder).Layers + (uint)layer,window->DrawList);
  if (0 < (window->DC).ChildWindows.Size) {
    lVar2 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar2];
      if ((window_00->Active == true) && (window_00->Hidden == false)) {
        AddWindowToDrawData(window_00,layer);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (window->DC).ChildWindows.Size);
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(&window->Viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}